

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2connection.cpp
# Opt level: O2

bool __thiscall QHttp2Stream::sendRST_STREAM(QHttp2Stream *this,Http2Error errorCode)

{
  FrameWriter *this_00;
  undefined1 uVar1;
  QHttp2Connection *pQVar2;
  QIODevice *pQVar3;
  ssize_t sVar4;
  size_t __n;
  void *__buf;
  long in_FS_OFFSET;
  char local_50 [24];
  char *local_38;
  Http2Error errorCode_local;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = 0;
  errorCode_local = errorCode;
  if ((*(int *)(this + 0x68) != 0) && (*(int *)(this + 0x68) != 5)) {
    if (this[0x24] == (QHttp2Stream)0x0) {
      pQVar2 = getConnection(this);
      QHttp2Connection::registerStreamAsResetLocally
                ((QHttp2Connection *)pQVar2,*(quint32 *)(this + 0x10));
      std::optional<unsigned_int>::operator=
                ((optional<unsigned_int> *)(this + 0x28),&errorCode_local);
      qHttp2ConnectionLog();
      if (((byte)qHttp2ConnectionLog::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1)
          != 0) {
        local_50[0] = '\x02';
        local_50[1] = '\0';
        local_50[2] = '\0';
        local_50[3] = '\0';
        local_50[4] = '\0';
        local_50[5] = '\0';
        local_50[6] = '\0';
        local_50[7] = '\0';
        local_50[8] = '\0';
        local_50[9] = '\0';
        local_50[10] = '\0';
        local_50[0xb] = '\0';
        local_50[0xc] = '\0';
        local_50[0xd] = '\0';
        local_50[0xe] = '\0';
        local_50[0xf] = '\0';
        local_50[0x10] = '\0';
        local_50[0x11] = '\0';
        local_50[0x12] = '\0';
        local_50[0x13] = '\0';
        local_50[0x14] = '\0';
        local_50[0x15] = '\0';
        local_50[0x16] = '\0';
        local_50[0x17] = '\0';
        local_38 = qHttp2ConnectionLog::category.name;
        pQVar2 = getConnection(this);
        QMessageLogger::debug
                  (local_50,"[%p] sending RST_STREAM on stream %u, code: %u",pQVar2,
                   (ulong)*(uint *)(this + 0x10),(ulong)errorCode_local);
      }
      transitionState(this,RST);
      pQVar2 = getConnection(this);
      this_00 = &pQVar2->frameWriter;
      __n = (size_t)*(uint *)(this + 0x10);
      Http2::FrameWriter::start(this_00,RST_STREAM,(FrameFlags)0x0,*(uint *)(this + 0x10));
      Http2::FrameWriter::append<unsigned_int>(this_00,errorCode_local);
      pQVar3 = QHttp2Connection::getSocket((QHttp2Connection *)pQVar2);
      sVar4 = Http2::FrameWriter::write(this_00,(int)pQVar3,__buf,__n);
      uVar1 = (undefined1)sVar4;
    }
    else {
      uVar1 = 0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (bool)uVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QHttp2Stream::sendRST_STREAM(Http2::Http2Error errorCode)
{
    if (m_state == State::Closed || m_state == State::Idle)
        return false;
    // Never respond to a RST_STREAM with a RST_STREAM or looping might occur.
    if (m_RST_STREAM_received.has_value())
        return false;

    getConnection()->registerStreamAsResetLocally(streamID());

    m_RST_STREAM_sent = errorCode;
    qCDebug(qHttp2ConnectionLog, "[%p] sending RST_STREAM on stream %u, code: %u", getConnection(),
            m_streamID, errorCode);
    transitionState(StateTransition::RST);

    QHttp2Connection *connection = getConnection();
    FrameWriter &frameWriter = connection->frameWriter;
    frameWriter.start(FrameType::RST_STREAM, FrameFlag::EMPTY, m_streamID);
    frameWriter.append(quint32(errorCode));
    return frameWriter.write(*connection->getSocket());
}